

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O3

void __thiscall ProfileData::Add(ProfileData *this,int depth,void **stack)

{
  Entry *pEVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Entry *entry;
  ulong uVar8;
  
  if (-1 < this->out_) {
    uVar4 = 0xfe;
    if (depth < 0xfe) {
      uVar4 = depth;
    }
    if (depth < 1) {
      syscall(1,2,"Check failed: depth > 0: ProfileData::Add depth <= 0\n",0x35);
      abort();
    }
    uVar8 = (ulong)uVar4;
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar6 = (long)stack[uVar3] * 0x29 + (uVar6 << 8 | uVar6 >> 0x38);
      uVar3 = uVar3 + 1;
    } while (uVar8 != uVar3);
    this->count_ = this->count_ + 1;
    uVar3 = (ulong)(((uint)uVar6 & 0x3ff) << 0xd);
    pEVar1 = (Entry *)((long)this->hash_->entry[0].stack + (uVar3 - 0x10));
    uVar6 = 1;
    if (1 < (int)uVar4) {
      uVar6 = (ulong)uVar4;
    }
    lVar5 = (long)this->hash_->entry[0].stack + uVar3;
    lVar7 = 0;
    do {
      if (pEVar1[lVar7].depth == uVar8) {
        uVar3 = 0;
        while (*(void **)(lVar5 + uVar3 * 8) == stack[uVar3]) {
          uVar3 = uVar3 + 1;
          if (uVar6 == uVar3) {
            pEVar1[lVar7].count = pEVar1[lVar7].count + 1;
            return;
          }
        }
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x800;
    } while (lVar7 != 4);
    uVar3 = pEVar1->count;
    lVar5 = 0x800;
    entry = pEVar1;
    do {
      uVar2 = *(ulong *)((long)pEVar1->stack + lVar5 + -0x10);
      if (uVar2 < uVar3) {
        entry = (Entry *)((long)pEVar1->stack + lVar5 + -0x10);
        uVar3 = uVar2;
      }
      lVar5 = lVar5 + 0x800;
    } while (lVar5 != 0x2000);
    if (entry->count != 0) {
      this->evictions_ = this->evictions_ + 1;
      Evict(this,entry);
    }
    entry->depth = uVar8;
    entry->count = 1;
    uVar3 = 0;
    do {
      entry->stack[uVar3] = (Slot)stack[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

void ProfileData::Add(int depth, const void* const* stack) {
  if (!enabled()) {
    return;
  }

  if (depth > kMaxStackDepth) depth = kMaxStackDepth;
  RAW_CHECK(depth > 0, "ProfileData::Add depth <= 0");

  // Make hash-value
  Slot h = 0;
  for (int i = 0; i < depth; i++) {
    Slot slot = reinterpret_cast<Slot>(stack[i]);
    h = (h << 8) | (h >> (8*(sizeof(h)-1)));
    h += (slot * 31) + (slot * 7) + (slot * 3);
  }

  count_++;

  // See if table already has an entry for this trace
  bool done = false;
  Bucket* bucket = &hash_[h % kBuckets];
  for (int a = 0; a < kAssociativity; a++) {
    Entry* e = &bucket->entry[a];
    if (e->depth == depth) {
      bool match = true;
      for (int i = 0; i < depth; i++) {
        if (e->stack[i] != reinterpret_cast<Slot>(stack[i])) {
          match = false;
          break;
        }
      }
      if (match) {
        e->count++;
        done = true;
        break;
      }
    }
  }

  if (!done) {
    // Evict entry with smallest count
    Entry* e = &bucket->entry[0];
    for (int a = 1; a < kAssociativity; a++) {
      if (bucket->entry[a].count < e->count) {
        e = &bucket->entry[a];
      }
    }
    if (e->count > 0) {
      evictions_++;
      Evict(*e);
    }

    // Use the newly evicted entry
    e->depth = depth;
    e->count = 1;
    for (int i = 0; i < depth; i++) {
      e->stack[i] = reinterpret_cast<Slot>(stack[i]);
    }
  }
}